

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPack.c
# Opt level: O2

void Aig_ManPackPrintCare(Aig_ManPack_t *p)

{
  Vec_Ptr_t *p_00;
  int i;
  int i_00;
  
  for (i_00 = 0; p_00 = p->pAig->vCis, i_00 < p_00->nSize; i_00 = i_00 + 1) {
    Vec_PtrEntry(p_00,i_00);
    Vec_WrdEntry(p->vPiCare,i_00);
  }
  return;
}

Assistant:

void Aig_ManPackPrintCare( Aig_ManPack_t * p )
{
    Aig_Obj_t * pObj;
    word Sign;
    int i;
    Aig_ManForEachCi( p->pAig, pObj, i )
    {
        Sign = Vec_WrdEntry( p->vPiCare, i );
//        Extra_PrintBinary( stdout, (unsigned *)&Sign, 64 );
//        printf( "\n" );
    }
//    printf( "\n" );
}